

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

void pbrt::ParseFiles(SceneRepresentation *scene,
                     span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     filenames)

{
  bool bVar1;
  iterator pbVar2;
  unique_ptr<pbrt::Tokenizer,_std::default_delete<pbrt::Tokenizer>_> *in_RDI;
  unique_ptr<pbrt::Tokenizer,_std::default_delete<pbrt::Tokenizer>_> t_1;
  string *fn;
  iterator __end2;
  iterator __begin2;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *__range2;
  function<void_(const_char_*,_const_pbrt::FileLoc_*)> *in_stack_000000d0;
  string *in_stack_000000d8;
  unique_ptr<pbrt::Tokenizer,_std::default_delete<pbrt::Tokenizer>_> t;
  anon_class_1_0_00000001 tokError;
  unique_ptr<pbrt::Tokenizer,_std::default_delete<pbrt::Tokenizer>_> *in_stack_00001f58;
  SceneRepresentation *in_stack_00001f60;
  unique_ptr<pbrt::Tokenizer,_std::default_delete<pbrt::Tokenizer>_> *in_stack_fffffffffffffee8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffef0;
  anon_class_1_0_00000001 *in_stack_fffffffffffffef8;
  function<void_(const_char_*,_const_pbrt::FileLoc_*)> *in_stack_ffffffffffffff00;
  allocator<char> *__a;
  char *in_stack_ffffffffffffff28;
  undefined8 in_stack_ffffffffffffff30;
  string *in_stack_ffffffffffffff50;
  iterator local_98;
  allocator<char> local_49;
  string local_48 [48];
  unique_ptr<pbrt::Tokenizer,_std::default_delete<pbrt::Tokenizer>_> *local_18;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_10;
  
  local_18 = in_RDI;
  bVar1 = pstd::
          span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::empty((span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)0x447dfc);
  if (bVar1) {
    __a = &local_49;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,__a);
    std::function<void(char_const*,pbrt::FileLoc_const*)>::
    function<pbrt::ParseFiles(pbrt::SceneRepresentation*,pstd::span<std::__cxx11::string_const>)::__0&,void>
              (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
    Tokenizer::CreateFromFile(in_stack_000000d8,in_stack_000000d0);
    std::function<void_(const_char_*,_const_pbrt::FileLoc_*)>::~function
              ((function<void_(const_char_*,_const_pbrt::FileLoc_*)> *)0x447e75);
    std::__cxx11::string::~string(local_48);
    std::allocator<char>::~allocator(&local_49);
    bVar1 = std::unique_ptr::operator_cast_to_bool
                      ((unique_ptr<pbrt::Tokenizer,_std::default_delete<pbrt::Tokenizer>_> *)
                       0x447e9c);
    if (bVar1) {
      std::unique_ptr<pbrt::Tokenizer,_std::default_delete<pbrt::Tokenizer>_>::unique_ptr
                ((unique_ptr<pbrt::Tokenizer,_std::default_delete<pbrt::Tokenizer>_> *)
                 in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
      parse(in_stack_00001f60,in_stack_00001f58);
      std::unique_ptr<pbrt::Tokenizer,_std::default_delete<pbrt::Tokenizer>_>::~unique_ptr
                ((unique_ptr<pbrt::Tokenizer,_std::default_delete<pbrt::Tokenizer>_> *)
                 in_stack_fffffffffffffef0);
    }
    std::unique_ptr<pbrt::Tokenizer,_std::default_delete<pbrt::Tokenizer>_>::~unique_ptr
              ((unique_ptr<pbrt::Tokenizer,_std::default_delete<pbrt::Tokenizer>_> *)
               in_stack_fffffffffffffef0);
  }
  else {
    local_98 = pstd::
               span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::begin(&local_10);
    pbVar2 = pstd::
             span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::end(&local_10);
    for (; local_98 != pbVar2; local_98 = local_98 + 1) {
      bVar1 = std::operator!=(in_stack_fffffffffffffef0,(char *)in_stack_fffffffffffffee8);
      if (bVar1) {
        SetSearchDirectory(in_stack_ffffffffffffff50);
      }
      std::function<void(char_const*,pbrt::FileLoc_const*)>::
      function<pbrt::ParseFiles(pbrt::SceneRepresentation*,pstd::span<std::__cxx11::string_const>)::__0&,void>
                ((function<void_(const_char_*,_const_pbrt::FileLoc_*)> *)&stack0xffffffffffffff30,
                 (anon_class_1_0_00000001 *)local_98);
      Tokenizer::CreateFromFile(in_stack_000000d8,in_stack_000000d0);
      std::function<void_(const_char_*,_const_pbrt::FileLoc_*)>::~function
                ((function<void_(const_char_*,_const_pbrt::FileLoc_*)> *)0x448043);
      bVar1 = std::unique_ptr::operator_cast_to_bool
                        ((unique_ptr<pbrt::Tokenizer,_std::default_delete<pbrt::Tokenizer>_> *)
                         0x44804d);
      if (bVar1) {
        in_stack_fffffffffffffef0 =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &stack0xffffffffffffff28;
        in_stack_fffffffffffffee8 = local_18;
        std::unique_ptr<pbrt::Tokenizer,_std::default_delete<pbrt::Tokenizer>_>::unique_ptr
                  ((unique_ptr<pbrt::Tokenizer,_std::default_delete<pbrt::Tokenizer>_> *)
                   in_stack_fffffffffffffef0,local_18);
        parse(in_stack_00001f60,in_stack_00001f58);
        std::unique_ptr<pbrt::Tokenizer,_std::default_delete<pbrt::Tokenizer>_>::~unique_ptr
                  ((unique_ptr<pbrt::Tokenizer,_std::default_delete<pbrt::Tokenizer>_> *)
                   in_stack_fffffffffffffef0);
      }
      std::unique_ptr<pbrt::Tokenizer,_std::default_delete<pbrt::Tokenizer>_>::~unique_ptr
                ((unique_ptr<pbrt::Tokenizer,_std::default_delete<pbrt::Tokenizer>_> *)
                 in_stack_fffffffffffffef0);
    }
  }
  return;
}

Assistant:

void ParseFiles(SceneRepresentation *scene, pstd::span<const std::string> filenames) {
    auto tokError = [](const char *msg, const FileLoc *loc) {
        ErrorExit(loc, "%s", msg);
    };

    // Process scene description
    if (filenames.empty()) {
        // Parse scene from standard input
        std::unique_ptr<Tokenizer> t = Tokenizer::CreateFromFile("-", tokError);
        if (t)
            parse(scene, std::move(t));
    } else {
        // Parse scene from input files
        for (const std::string &fn : filenames) {
            if (fn != "-")
                SetSearchDirectory(fn);

            std::unique_ptr<Tokenizer> t = Tokenizer::CreateFromFile(fn, tokError);
            if (t)
                parse(scene, std::move(t));
        }
    }
}